

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interface_var_sroa.cpp
# Opt level: O0

Status __thiscall
spvtools::opt::InterfaceVariableScalarReplacement::Process(InterfaceVariableScalarReplacement *this)

{
  bool bVar1;
  Status b;
  Instruction *entry_point_00;
  Instruction *entry_point;
  iterator __end2;
  iterator __begin2;
  IteratorRange<spvtools::opt::InstructionList::iterator> *__range2;
  Status status;
  InterfaceVariableScalarReplacement *this_local;
  
  __range2._4_4_ = SuccessWithoutChange;
  Pass::get_module(&this->super_Pass);
  Module::entry_points((Module *)&__begin2);
  IteratorRange<spvtools::opt::InstructionList::iterator>::begin
            ((IteratorRange<spvtools::opt::InstructionList::iterator> *)&__end2);
  IteratorRange<spvtools::opt::InstructionList::iterator>::end
            ((IteratorRange<spvtools::opt::InstructionList::iterator> *)&entry_point);
  while( true ) {
    bVar1 = utils::operator!=(&__end2.super_iterator,
                              (iterator_template<spvtools::opt::Instruction> *)&entry_point);
    if (!bVar1) break;
    entry_point_00 =
         utils::IntrusiveList<spvtools::opt::Instruction>::
         iterator_template<spvtools::opt::Instruction>::operator*(&__end2.super_iterator);
    b = ReplaceInterfaceVarsWithScalars(this,entry_point_00);
    __range2._4_4_ = CombineStatus(__range2._4_4_,b);
    InstructionList::iterator::operator++(&__end2);
  }
  return __range2._4_4_;
}

Assistant:

Pass::Status InterfaceVariableScalarReplacement::Process() {
  Pass::Status status = Status::SuccessWithoutChange;
  for (Instruction& entry_point : get_module()->entry_points()) {
    status =
        CombineStatus(status, ReplaceInterfaceVarsWithScalars(entry_point));
  }
  return status;
}